

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int addToSavepointBitvecs(Pager *pPager,Pgno pgno)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  
  if (pPager->nSavepoint < 1) {
    uVar2 = 0;
  }
  else {
    lVar4 = 0;
    lVar3 = 0x18;
    uVar2 = 0;
    do {
      if (pgno <= *(uint *)((long)pPager->aSavepoint->aWalData + lVar3 + -0x24)) {
        uVar1 = sqlite3BitvecSet(*(Bitvec **)((long)pPager->aSavepoint->aWalData + lVar3 + -0x2c),
                                 pgno);
        uVar2 = uVar2 | uVar1;
      }
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x38;
    } while (lVar4 < pPager->nSavepoint);
  }
  return uVar2;
}

Assistant:

static int addToSavepointBitvecs(Pager *pPager, Pgno pgno){
  int ii;                   /* Loop counter */
  int rc = SQLITE_OK;       /* Result code */

  for(ii=0; ii<pPager->nSavepoint; ii++){
    PagerSavepoint *p = &pPager->aSavepoint[ii];
    if( pgno<=p->nOrig ){
      rc |= sqlite3BitvecSet(p->pInSavepoint, pgno);
      testcase( rc==SQLITE_NOMEM );
      assert( rc==SQLITE_OK || rc==SQLITE_NOMEM );
    }
  }
  return rc;
}